

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData_Soviet.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData_Soviet::operator==
          (FundamentalOperationalData_Soviet *this,FundamentalOperationalData_Soviet *Value)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((Value->field_0).m_ui8SystemStatus == (this->field_0).m_ui8SystemStatus);
  auVar1[1] = -(Value->m_ui8AltParam4 == this->m_ui8AltParam4);
  auVar1[2] = -((Value->field_2).m_ui8InfoLayers == (this->field_2).m_ui8InfoLayers);
  auVar1[3] = -(Value->m_ui8Modifier == this->m_ui8Modifier);
  auVar1[4] = -(*(char *)&Value->field_4 == *(char *)&this->field_4);
  auVar1[5] = -(*(char *)((long)&Value->field_4 + 1) == *(char *)((long)&this->field_4 + 1));
  auVar1[6] = -(*(char *)&Value->field_5 == *(char *)&this->field_5);
  auVar1[7] = -(*(char *)((long)&Value->field_5 + 1) == *(char *)((long)&this->field_5 + 1));
  auVar1[8] = -(*(char *)&Value->field_6 == *(char *)&this->field_6);
  auVar1[9] = -(*(char *)((long)&Value->field_6 + 1) == *(char *)((long)&this->field_6 + 1));
  auVar1[10] = -(*(char *)&Value->field_7 == *(char *)&this->field_7);
  auVar1[0xb] = -(*(char *)((long)&Value->field_7 + 1) == *(char *)((long)&this->field_7 + 1));
  auVar1[0xc] = -(*(char *)&Value->field_8 == *(char *)&this->field_8);
  auVar1[0xd] = -(*(char *)((long)&Value->field_8 + 1) == *(char *)((long)&this->field_8 + 1));
  auVar1[0xe] = -(*(char *)&Value->field_9 == *(char *)&this->field_9);
  auVar1[0xf] = -(*(char *)((long)&Value->field_9 + 1) == *(char *)((long)&this->field_9 + 1));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

KBOOL FundamentalOperationalData_Soviet::operator == ( const FundamentalOperationalData_Soviet & Value ) const
{
    if( m_ui8SystemStatus   != Value.m_ui8SystemStatus )    return false;
    if( m_ui8AltParam4      != Value.m_ui8AltParam4 )       return false;
    if( m_ui8InfoLayers     != Value.m_ui8InfoLayers )      return false;
    if( m_ui8Modifier       != Value.m_ui8Modifier )        return false;
    if( m_ui16Param1        != Value.m_ui16Param1 )         return false;
    if( m_ui16Param2        != Value.m_ui16Param2 )         return false;
    if( m_ui16Param3        != Value.m_ui16Param3 )         return false;
    if( m_ui16Param4        != Value.m_ui16Param4 )         return false;
    if( m_ui16Param5        != Value.m_ui16Param5 )         return false;
    if( m_ui16Param6        != Value.m_ui16Param6 )         return false;
    return true;
}